

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O1

int ref_nonsingle_cell(saucy *s,coloring *c,int cf)

{
  int iVar1;
  uint uVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  int *piVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  int iVar16;
  long lVar17;
  
  piVar3 = c->lab;
  iVar13 = c->clen[cf];
  iVar8 = iVar13 + cf;
  iVar1 = s->conncnts[cf];
  iVar7 = iVar8 - iVar1;
  iVar10 = iVar7 + 1;
  piVar4 = s->ccount;
  piVar5 = s->count;
  iVar16 = piVar4[piVar3[(long)iVar7 + 1]];
  uVar14 = (ulong)iVar16;
  piVar5[(long)iVar7 + 1] = iVar16;
  piVar6 = s->bucket;
  piVar6[uVar14] = 1;
  iVar12 = iVar16;
  if (iVar10 < iVar8) {
    lVar15 = (long)(iVar7 + 2);
    do {
      uVar2 = piVar4[piVar3[lVar15]];
      lVar9 = (long)(int)uVar2;
      if ((int)uVar2 < iVar16) {
        lVar17 = (long)iVar16;
        memset(piVar6 + (lVar17 - (ulong)(~uVar2 + iVar16)) + -1,0,(ulong)(~uVar2 + iVar16) * 4 + 4)
        ;
        do {
          lVar17 = lVar17 + -1;
        } while (lVar9 < lVar17);
        iVar16 = (int)lVar17;
      }
      uVar11 = (uint)uVar14;
      if ((int)uVar11 < (int)uVar2) {
        memset(piVar6 + (long)(int)uVar11 + 1,0,(ulong)(~uVar11 + uVar2) * 4 + 4);
        lVar17 = 0;
        do {
          lVar17 = lVar17 + -1;
        } while ((int)uVar11 - lVar9 != lVar17);
        uVar14 = (ulong)(uVar11 - (int)lVar17);
      }
      iVar12 = (int)uVar14;
      piVar6[lVar9] = piVar6[lVar9] + 1;
      piVar5[lVar15] = uVar2;
      lVar15 = lVar15 + 1;
    } while (iVar13 + cf + 1 != (int)lVar15);
  }
  if ((iVar10 != cf) || (iVar16 != iVar12)) {
    lVar15 = (long)iVar16;
    if (iVar16 <= iVar12) {
      lVar9 = 0;
      iVar13 = iVar10;
      do {
        if (piVar6[lVar15 + lVar9] != 0) {
          iVar13 = iVar13 + piVar6[lVar15 + lVar9];
          piVar6[lVar15 + lVar9] = iVar13;
        }
        lVar9 = lVar9 + 1;
      } while ((iVar12 - iVar16) + 1 != (int)lVar9);
    }
    if (0 < iVar1) {
      piVar4 = s->junk;
      lVar9 = (long)iVar10 + -1;
      do {
        iVar13 = piVar3[lVar9 + 1];
        iVar7 = piVar6[piVar5[lVar9 + 1]];
        piVar6[piVar5[lVar9 + 1]] = iVar7 + -1;
        piVar4[(long)iVar7 + -1] = iVar13;
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar8);
    }
    if (0 < iVar1) {
      piVar4 = s->junk;
      piVar5 = c->unlab;
      lVar9 = (long)iVar10 + -1;
      do {
        iVar13 = piVar4[lVar9 + 1];
        piVar3[lVar9 + 1] = iVar13;
        piVar5[iVar13] = iVar10;
        lVar9 = lVar9 + 1;
        iVar10 = iVar10 + 1;
      } while (lVar9 < iVar8);
    }
    if (iVar16 < iVar12) {
      lVar9 = (long)iVar12;
      do {
        if ((s->bucket[lVar9] != 0) && (iVar10 = (*s->split)(s,c,cf,s->bucket[lVar9]), iVar10 == 0))
        {
          return 0;
        }
        lVar9 = lVar9 + -1;
      } while (lVar15 < lVar9);
    }
    if (s->bucket[lVar15] != cf) {
      iVar10 = (*s->split)(s,c,cf,s->bucket[lVar15]);
      return iVar10;
    }
  }
  return 1;
}

Assistant:

static int
ref_nonsingle_cell(struct saucy *s, struct coloring *c, int cf)
{
    int cnt, i, cb, nzf, ff, fb, bmin, bmax;

    /* Find the front and back */
    cb = cf + c->clen[cf];
    nzf = cb - s->conncnts[cf] + 1;

    /* Prepare the buckets */
    ff = nzf;
    cnt = s->ccount[c->lab[ff]];
    s->count[ff] = bmin = bmax = cnt;
    s->bucket[cnt] = 1;

    /* Iterate through the rest of the vertices */
    while (++ff <= cb) {
        cnt = s->ccount[c->lab[ff]];

        /* Initialize intermediate buckets */
        while (bmin > cnt) s->bucket[--bmin] = 0;
        while (bmax < cnt) s->bucket[++bmax] = 0;

        /* Mark this count */
        ++s->bucket[cnt];
        s->count[ff] = cnt;
    }

    /* If they all had the same count, bail */
    if (bmin == bmax && cf == nzf) return 1;
    ff = fb = nzf;

    /* Calculate bucket locations, sizes */
    for (i = bmin; i <= bmax; ++i, ff = fb) {
        if (!s->bucket[i]) continue;
        fb = ff + s->bucket[i];
        s->bucket[i] = fb;
    }

    /* Repair the partition nest */
    for (i = nzf; i <= cb; ++i) {
        s->junk[--s->bucket[s->count[i]]] = c->lab[i];
    }
    for (i = nzf; i <= cb; ++i) {
        set_label(c, i, s->junk[i]);
    }

    /* Split; induce */
    for (i = bmax; i > bmin; --i) {
        ff = s->bucket[i];
        if (ff && !s->split(s, c, cf, ff)) return 0;
    }

    /* If there was a zero area, then there's one more cell */
    return maybe_split(s, c, cf, s->bucket[bmin]);
}